

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O2

size_t qc_file_read(QcFile *file,void *buf,size_t nbytes)

{
  size_t sVar1;
  
  if (file != (QcFile *)0x0) {
    sVar1 = read(file->filedes,buf,nbytes);
    return sVar1;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
          ,0x5f);
  __assert_fail("file",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x5f,"size_t qc_file_read(QcFile *, void *, size_t)");
}

Assistant:

size_t qc_file_read(QcFile *file, void *buf, size_t nbytes)
{
    size_t ssz;

    qc_assert(file);
    
    ssz = read(file->filedes, buf, nbytes);
    if(ssz < 0)
    {
        qc_error("file read failed");
        return -1;
    }

    return ssz;
}